

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::double_writer::operator()
          (double_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  double_writer dVar1;
  ulong uVar2;
  char cVar3;
  double_writer *pdVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  double_writer local_8 [8];
  
  dVar1 = this[8];
  if (dVar1 != (double_writer)0x0) {
    pdVar4 = (double_writer *)(it->super_truncating_iterator_base<char_*>).out_;
    uVar2 = (it->super_truncating_iterator_base<char_*>).count_;
    (it->super_truncating_iterator_base<char_*>).count_ = uVar2 + 1;
    if (uVar2 < (it->super_truncating_iterator_base<char_*>).limit_) {
      (it->super_truncating_iterator_base<char_*>).out_ = (char *)(pdVar4 + 1);
    }
    else {
      pdVar4 = local_8;
    }
    *pdVar4 = dVar1;
    *(long *)this = *(long *)this + -1;
  }
  lVar7 = *(long *)(*(long *)(this + 0x10) + 0x10);
  pcVar5 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar8 = (it->super_truncating_iterator_base<char_*>).count_;
  cVar6 = it->blackhole_;
  if (0 < lVar7) {
    pcVar9 = *(char **)(*(long *)(this + 0x10) + 8);
    lVar7 = lVar7 + 1;
    do {
      cVar3 = *pcVar9;
      if (sVar8 < uVar2) {
        *pcVar5 = *pcVar9;
        cVar3 = cVar6;
      }
      cVar6 = cVar3;
      pcVar9 = pcVar9 + 1;
      pcVar5 = pcVar5 + (sVar8 < uVar2);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pcVar5;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar8;
  it->blackhole_ = cVar6;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }